

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O1

int Abc_ZddPermProduct(Abc_ZddMan *p,int a,int b)

{
  Abc_ZddEnt *pAVar1;
  Abc_ZddObj *pAVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  iVar3 = a;
  if ((((a != 0) && (iVar3 = b, a != 1)) && (b != 0)) && (iVar3 = a, b != 1)) {
    pAVar1 = p->pCache;
    uVar6 = a * 0xc00005 + b * 0x40f1f9 + 0x43e1e6;
    uVar5 = p->nCacheMask & uVar6;
    p->nCacheLookups = p->nCacheLookups + 1;
    iVar3 = -1;
    if (((pAVar1[uVar5].Arg0 == a) && (pAVar1[uVar5].Arg1 == b)) && (pAVar1[uVar5].Arg2 == 6)) {
      iVar3 = pAVar1[uVar5].Res;
    }
    if (iVar3 < 0) {
      pAVar2 = p->pObjs;
      iVar3 = Abc_ZddPermProduct(p,a,pAVar2[b].False);
      iVar4 = Abc_ZddPermProduct(p,a,pAVar2[b].True);
      iVar4 = Abc_ZddPerm(p,iVar4,*(uint *)(pAVar2 + b) & 0x7fffffff);
      iVar3 = Abc_ZddUnion(p,iVar3,iVar4);
      pAVar1 = p->pCache;
      uVar6 = uVar6 & p->nCacheMask;
      pAVar1[uVar6].Arg0 = a;
      pAVar1[uVar6].Arg1 = b;
      pAVar1[uVar6].Arg2 = 6;
      pAVar1[uVar6].Res = iVar3;
      p->nCacheMisses = p->nCacheMisses + 1;
      if (iVar3 < 0) {
        __assert_fail("Res >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                      ,0x82,"int Abc_ZddCacheInsert(Abc_ZddMan *, int, int, int, int)");
      }
    }
  }
  return iVar3;
}

Assistant:

int Abc_ZddPermProduct( Abc_ZddMan * p, int a, int b )
{
    Abc_ZddObj * B; 
    int r0, r1, r;
    if ( a == 0 ) return 0;
    if ( a == 1 ) return b;
    if ( b == 0 ) return 0;
    if ( b == 1 ) return a;
    if ( (r = Abc_ZddCacheLookup(p, a, b, ABC_ZDD_OPER_PERM_PROD)) >= 0 )
        return r;
    B  = Abc_ZddNode( p, b );
    r0 = Abc_ZddPermProduct( p, a, B->False ); 
    r1 = Abc_ZddPermProduct( p, a, B->True ); 
    r1 = Abc_ZddPerm( p, r1, B->Var );
    r  = Abc_ZddUnion( p, r0, r1 );
    return Abc_ZddCacheInsert( p, a, b, ABC_ZDD_OPER_PERM_PROD, r );
}